

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O3

void find_moves(void)

{
  char *pcVar1;
  bool bVar2;
  int ***pppiVar3;
  int iVar4;
  char **ppcVar5;
  char c;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  calc_adj();
  c = 'A';
  do {
    calc_legal(c);
    pppiVar3 = adj;
    c = c + '\x01';
  } while (c != '[');
  if (start == true) {
    adj[1][6][6] = 1;
    (*pppiVar3)[6][6] = 1;
  }
  full_rack = rack_size == 7;
  std::vector<Move,_std::allocator<Move>_>::_M_erase_at_end
            (&moves,moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if (0 < bsize) {
    lVar10 = 0;
    lVar6 = 1;
    iVar4 = bsize;
    do {
      if (0 < iVar4) {
        lVar8 = 0;
        ppcVar5 = board;
        lVar9 = 1;
        do {
          lVar7 = lVar8;
          if (ppcVar5[lVar6][lVar9] == '\0') {
            do {
              pcVar1 = ppcVar5[lVar6] + lVar7;
              lVar7 = lVar7 + -1;
            } while ('\x01' < *pcVar1);
            find_moves_at((int)lVar6,(int)lVar7 + 2,true,false,-1,0);
            lVar7 = lVar10;
            do {
              ppcVar5 = board + lVar7;
              lVar7 = lVar7 + -1;
            } while ('\x01' < (*ppcVar5)[lVar9]);
            find_moves_at((int)lVar7 + 2,(int)lVar9,false,false,-1,0);
            ppcVar5 = board;
            iVar4 = bsize;
          }
          lVar8 = lVar8 + 1;
          bVar2 = lVar9 < iVar4;
          lVar9 = lVar9 + 1;
        } while (bVar2);
      }
      lVar10 = lVar10 + 1;
      bVar2 = lVar6 < iVar4;
      lVar6 = lVar6 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void find_moves() {
    calc_adj();
    calc_legal_all();
    if (start) adj[0][6][6] = adj[1][6][6] = 1;
    full_rack = (rack_size == 7);
    moves.clear();
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            if (board[i][j] == 0) { //only look on free squares to avoid redundancy
                int j1 = j;
                while (board[i][--j1] > 1); //go to leftmost taken square on board
                find_moves_at(i, j1 + 1, true);
                int i1 = i;
                while (board[--i1][j] > 1);
                find_moves_at(i1 + 1, j, false);
            }
        }
    }
}